

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O2

SExpr * SExprAlloc(SExprParser *parser,SExprType type)

{
  SExprPool *pSVar1;
  ulong uVar2;
  SExpr *pSVar3;
  
  pSVar1 = parser->pool;
  uVar2 = parser->poolUsed;
  if (pSVar1 == (SExprPool *)0x0) {
    parser->poolUsed = uVar2 + 1;
    return &SExprAlloc::dummy;
  }
  if (uVar2 < pSVar1->count) {
    pSVar3 = pSVar1->data;
    parser->poolUsed = uVar2 + 1;
    pSVar3[uVar2].type = type;
    pSVar3[uVar2].next = (SExpr *)0x0;
    return pSVar3 + uVar2;
  }
  (parser->result).type = SE_INSUFFICIENT_SPACE;
  return (SExpr *)0x0;
}

Assistant:

SEXPR_DEF SExpr* SExprAlloc(SExprParser* parser, SExprType type)
{
    static SExpr dummy;

    if(!parser->pool) {
        ++parser->poolUsed;
        return &dummy;
    }

    if(parser->poolUsed >= parser->pool->count) {
        parser->result.type = SE_INSUFFICIENT_SPACE;
        return NULL;
    }

    SExpr* expr = &parser->pool->data[parser->poolUsed++];

    expr->type = type;
    expr->next = NULL;

    return expr;
}